

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermNode * __thiscall
glslang::HlslParseContext::transformEntryPoint
          (HlslParseContext *this,TSourceLoc *loc,TFunction *userFunction,TAttributes *attributes)

{
  int *piVar1;
  char *pcVar2;
  undefined8 uVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TQualifier *pTVar7;
  undefined4 extraout_var_02;
  long lVar8;
  TType *pTVar24;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TPoolAllocator *pTVar9;
  TIntermAggregate *pTVar10;
  undefined4 extraout_var_16;
  long *plVar11;
  long *plVar12;
  TIntermSymbol *pTVar13;
  TIntermAggregate *this_00;
  undefined4 extraout_var_18;
  TIntermTyped *pTVar14;
  TIntermConstantUnion *left;
  TVariable *pTVar15;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  TIntermSymbol *pTVar16;
  undefined4 extraout_var_21;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar17;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  ulong uVar18;
  pointer ppTVar19;
  pointer ppTVar20;
  TIntermediate *pTVar21;
  TIntermTyped *pTVar22;
  uint uVar23;
  TIntermTyped *callingArgs;
  TVariable *entryPointOutput;
  TIntermNode *synthFunctionDef;
  TFunction synthEntryPoint;
  TType voidType;
  TFunction callee;
  undefined8 *local_4d0;
  pointer local_4c8;
  TIntermTyped *local_4c0;
  TIntermAggregate *local_4b8;
  TVariable *local_4b0;
  TPoolAllocator *local_4a8;
  undefined8 *local_4a0;
  iterator iStack_498;
  TVariable **local_490;
  TVector<glslang::TVariable_*> local_488;
  TPoolAllocator *local_468;
  long local_460;
  long lStack_458;
  undefined8 local_450;
  TVector<glslang::TVariable_*> local_448;
  TVariable *local_428;
  undefined1 local_420 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_408 [8];
  TFunction local_388;
  TType local_228;
  TFunction local_190;
  undefined4 extraout_var_17;
  
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar6),
                  (((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                  entryPointName)._M_dataplus._M_p);
  if (iVar6 != 0) {
    remapNonEntryPointIO(this,userFunction);
    return (TIntermNode *)0x0;
  }
  this->entryPointFunction = userFunction;
  handleEntryPointAttributes(this,loc,attributes);
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
  super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  remapEntryPointIO(this,userFunction,&local_428,&local_488,&local_448);
  ppTVar20 = local_488.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_428 != (TVariable *)0x0) {
    iVar6 = (*(local_428->super_TSymbol)._vptr_TSymbol[0xc])(local_428);
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x128))
                      ((long *)CONCAT44(extraout_var_00,iVar6));
    if (cVar4 != '\0') {
      iVar6 = (*(local_428->super_TSymbol)._vptr_TSymbol[0xc])(local_428);
      pTVar7 = (TQualifier *)
               (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_01,iVar6));
      bVar5 = TQualifier::isArrayedIo
                        (pTVar7,(this->super_TParseContextBase).super_TParseVersions.language);
      flatten(this,local_428,false,bVar5);
    }
    iVar6 = (*(local_428->super_TSymbol)._vptr_TSymbol[0xc])(local_428);
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x58))
                      ((long *)CONCAT44(extraout_var_02,iVar6));
    ppTVar20 = local_488.
               super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
               super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (1 < (*(uint *)(lVar8 + 8) >> 7 & 0x1ff) - 0x21) {
      assignToInterface(this,local_428);
      ppTVar20 = local_488.
                 super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                 super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  for (; ppTVar19 = local_448.
                    super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    .
                    super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
      ppTVar20 !=
      local_488.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppTVar20 = ppTVar20 + 1) {
    pTVar24._0_4_ = (TType *)(*((*ppTVar20)->super_TSymbol)._vptr_TSymbol[0xc])();
    if (((this->super_TParseContextBase).super_TParseVersions.language != EShLangTessEvaluation) ||
       (bVar5 = TType::operator()(pTVar24._0_4_), !bVar5)) {
      pTVar15 = *ppTVar20;
      iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x128))
                        ((long *)CONCAT44(extraout_var_03,iVar6));
      if (cVar4 != '\0') {
        iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
        pTVar7 = (TQualifier *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar6) + 0x58))
                           ((long *)CONCAT44(extraout_var_04,iVar6));
        bVar5 = TQualifier::isArrayedIo
                          (pTVar7,(this->super_TParseContextBase).super_TParseVersions.language);
        flatten(this,pTVar15,false,bVar5);
      }
      iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x58))
                        ((long *)CONCAT44(extraout_var_05,iVar6));
      if (1 < (*(uint *)(lVar8 + 8) >> 7 & 0x1ff) - 0x21) {
        assignToInterface(this,pTVar15);
      }
    }
  }
  for (; ppTVar19 !=
         local_448.
         super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
         super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
         _M_impl.super__Vector_impl_data._M_finish; ppTVar19 = ppTVar19 + 1) {
    pTVar15 = *ppTVar19;
    iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0x128))
                      ((long *)CONCAT44(extraout_var_06,iVar6));
    if (cVar4 != '\0') {
      iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
      pTVar7 = (TQualifier *)
               (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_07,iVar6));
      bVar5 = TQualifier::isArrayedIo
                        (pTVar7,(this->super_TParseContextBase).super_TParseVersions.language);
      flatten(this,pTVar15,false,bVar5);
    }
    iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
    lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0x58))
                      ((long *)CONCAT44(extraout_var_08,iVar6));
    if (1 < (*(uint *)(lVar8 + 8) >> 7 & 0x1ff) - 0x21) {
      assignToInterface(this,pTVar15);
    }
  }
  ppTVar20 = local_488.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation) {
    for (; ppTVar20 !=
           local_488.
           super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
           super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
           _M_impl.super__Vector_impl_data._M_finish; ppTVar20 = ppTVar20 + 1) {
      pTVar24._0_4_ = (TType *)(*((*ppTVar20)->super_TSymbol)._vptr_TSymbol[0xc])();
      if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation)
         && (bVar5 = TType::operator()(pTVar24._0_4_), bVar5)) {
        pTVar15 = *ppTVar20;
        iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x128))
                          ((long *)CONCAT44(extraout_var_09,iVar6));
        if (cVar4 != '\0') {
          iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
          pTVar7 = (TQualifier *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x58))
                             ((long *)CONCAT44(extraout_var_10,iVar6));
          bVar5 = TQualifier::isArrayedIo
                            (pTVar7,(this->super_TParseContextBase).super_TParseVersions.language);
          flatten(this,pTVar15,false,bVar5);
        }
        iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xc])(pTVar15);
        lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x58))
                          ((long *)CONCAT44(extraout_var_11,iVar6));
        if (1 < (*(uint *)(lVar8 + 8) >> 7 & 0x1ff) - 0x21) {
          assignToInterface(this,pTVar15);
        }
      }
    }
  }
  local_4a8 = GetThreadPoolAllocator();
  local_4a0 = (undefined8 *)0x0;
  iStack_498._M_current = (TVariable **)0x0;
  local_490 = (TVariable **)0x0;
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
  if (0 < iVar6) {
    uVar18 = 0;
    do {
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,uVar18);
      pTVar24 = *(TType **)(CONCAT44(extraout_var_12,iVar6) + 8);
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction);
      lVar8 = *(long *)CONCAT44(extraout_var_13,iVar6);
      iVar6 = (*pTVar24->_vptr_TType[10])(pTVar24);
      if ((*(uint *)(CONCAT44(extraout_var_14,iVar6) + 8) & 0x7f) == 5) {
        iVar6 = (*pTVar24->_vptr_TType[0x36])(pTVar24);
        if ((char)iVar6 == '\0') {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x40])
                    (this,loc,pTVar24,lVar8);
        }
        else {
          local_388.super_TSymbol._vptr_TSymbol =
               (_func_int **)makeInternalVariable(this,*(char **)(lVar8 + 8),pTVar24);
          if (iStack_498._M_current == local_490) {
            std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
            _M_realloc_insert<glslang::TVariable*const&>
                      ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                       &local_4a8,iStack_498,(TVariable **)&local_388);
          }
          else {
            *iStack_498._M_current = (TVariable *)local_388.super_TSymbol._vptr_TSymbol;
            iStack_498._M_current = iStack_498._M_current + 1;
          }
        }
      }
      uVar23 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar23;
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
    } while ((int)uVar23 < iVar6);
  }
  TSymbolTable::push((this->super_TParseContextBase).symbolTable);
  pTVar22 = (TIntermTyped *)0x0;
  TType::TType(&local_228,EbtVoid,EvqTemporary,1,0,0,false);
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  TFunction::TFunction(&local_388,(TString *)CONCAT44(extraout_var_15,iVar6),&local_228,EOpNull);
  pTVar9 = GetThreadPoolAllocator();
  pTVar10 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar9,0x188);
  TIntermAggregate::TIntermAggregate(pTVar10);
  local_4b8 = pTVar10;
  TIntermediate::setAggregateOperator
            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
             (TIntermNode *)pTVar10,EOpParameters,&local_228,loc);
  pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  pcVar2 = (char *)(pTVar21->entryPointMangledName)._M_string_length;
  strlen(local_388.mangledName._M_dataplus._M_p);
  std::__cxx11::string::_M_replace
            ((ulong)&pTVar21->entryPointMangledName,0,pcVar2,
             (ulong)local_388.mangledName._M_dataplus._M_p);
  piVar1 = &((this->super_TParseContextBase).super_TParseVersions.intermediate)->numEntryPoints;
  *piVar1 = *piVar1 + 1;
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])(userFunction);
  TFunction::TFunction(&local_190,(TString *)CONCAT44(extraout_var_16,iVar6),&local_228,EOpNull);
  (*(userFunction->super_TSymbol)._vptr_TSymbol[5])(userFunction,"@");
  local_468 = GetThreadPoolAllocator();
  local_460 = 0;
  lStack_458 = 0;
  local_450 = 0;
  pTVar9 = GetThreadPoolAllocator();
  pTVar10 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar9,0x188);
  TIntermAggregate::TIntermAggregate(pTVar10);
  local_4c8 = local_488.
              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4d0 = local_4a0;
  local_4c0 = (TIntermTyped *)0x0;
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(userFunction);
  pTVar14 = pTVar22;
  if (0 < iVar6) {
    do {
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,pTVar22);
      plVar11 = (long *)CONCAT44(extraout_var_17,iVar6);
      local_420._0_8_ = makeInternalVariable(this,*(char **)(*plVar11 + 8),(TType *)plVar11[1]);
      std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
      emplace_back<glslang::TVariable*>
                ((vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)
                 &local_468,(TVariable **)local_420);
      plVar12 = (long *)(**(code **)(**(long **)(lStack_458 + -8) + 0x68))();
      pTVar7 = (TQualifier *)(**(code **)(*plVar12 + 0x50))(plVar12);
      TQualifier::makeTemporary(pTVar7);
      lVar8 = (**(code **)(*(long *)plVar11[1] + 0x50))();
      pTVar15 = *(TVariable **)(lStack_458 + -8);
      if ((*(uint *)(lVar8 + 8) & 0x1ff0000) == 0x950000) {
        this->inputPatch = pTVar15;
      }
      pTVar13 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar15
                          );
      handleFunctionArgument(this,&local_190,&local_4c0,&pTVar13->super_TIntermTyped);
      lVar8 = (**(code **)(*(long *)plVar11[1] + 0x50))();
      if (((*(uint *)(lVar8 + 8) & 0x7f) < 0x14) &&
         ((0xd0000U >> (*(uint *)(lVar8 + 8) & 0x1f) & 1) != 0)) {
        this_00 = (TIntermAggregate *)
                  TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             *local_4c8);
        iVar6 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x1e])(this_00);
        lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar6) + 0x58))
                          ((long *)CONCAT44(extraout_var_18,iVar6));
        pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        if (((*(uint *)(lVar8 + 8) & 0xff80) == 0x1f80) && (pTVar21->dxPositionW == true)) {
          local_420._0_8_ = GetThreadPoolAllocator();
          local_420._8_8_ = local_408;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_420,"xyz","");
          local_4b0 = (TVariable *)
                      handleDotDereference(this,loc,(TIntermTyped *)this_00,(TString *)local_420);
          local_420._0_8_ = GetThreadPoolAllocator();
          local_420._8_8_ = local_408;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     local_420,"w","");
          pTVar14 = handleDotDereference(this,loc,(TIntermTyped *)this_00,(TString *)local_420);
          left = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,1.0,
                            EbtFloat,loc,false);
          pTVar15 = (TVariable *)
                    TIntermediate::addBinaryMath
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               EOpDiv,&left->super_TIntermTyped,pTVar14,loc);
          pTVar9 = GetThreadPoolAllocator();
          this_00 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar9,0x188);
          TIntermAggregate::TIntermAggregate(this_00,EOpConstructVec4);
          iVar6 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_00);
          local_420._0_8_ = local_4b0;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_19,iVar6),(TIntermNode **)local_420);
          iVar6 = (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(this_00);
          local_420._0_8_ = pTVar15;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_20,iVar6),(TIntermNode **)local_420);
          TType::TType((TType *)local_420,EbtFloat,EvqTemporary,4,0,0,false);
          (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(this_00,(TType *)local_420);
          (*(this_00->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [1])(this_00,loc);
          pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        }
        pTVar14 = handleAssign(this,loc,EOpAssign,&pTVar13->super_TIntermTyped,
                               (TIntermTyped *)this_00);
        TIntermediate::growAggregate(pTVar21,(TIntermNode *)pTVar10,&pTVar14->super_TIntermNode);
        local_4c8 = local_4c8 + 1;
      }
      lVar8 = (**(code **)(*(long *)plVar11[1] + 0x50))();
      if ((*(uint *)(lVar8 + 8) & 0x7f) == 5) {
        cVar4 = (**(code **)(*(long *)plVar11[1] + 0x1b0))();
        pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        if (cVar4 == '\0') {
          pTVar14 = handleVariable(this,loc,(TString *)*plVar11);
          pTVar14 = handleAssign(this,loc,EOpAssign,&pTVar13->super_TIntermTyped,pTVar14);
          TIntermediate::growAggregate(pTVar21,(TIntermNode *)pTVar10,&pTVar14->super_TIntermNode);
        }
        else {
          pTVar16 = TIntermediate::addSymbol(pTVar21,(TVariable *)*local_4d0);
          pTVar14 = handleAssign(this,loc,EOpAssign,&pTVar13->super_TIntermTyped,
                                 &pTVar16->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar21,(TIntermNode *)pTVar10,&pTVar14->super_TIntermNode);
          local_4d0 = local_4d0 + 1;
        }
      }
      uVar23 = (int)pTVar22 + 1;
      pTVar22 = (TIntermTyped *)(ulong)uVar23;
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
      pTVar14 = local_4c0;
    } while ((int)uVar23 < iVar6);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->currentCaller,&local_388.mangledName);
  pTVar14 = handleFunctionCall(this,loc,&local_190,pTVar14);
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[6])();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  _M_assign(&this->currentCaller,
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
            CONCAT44(extraout_var_21,iVar6));
  if (local_428 == (TVariable *)0x0) goto LAB_00409a20;
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
    pTVar13 = findTessLinkageSymbol(this,EbvInvocationId);
    if (pTVar13 == (TIntermSymbol *)0x0) {
      TType::TType((TType *)local_420,EbtUint,EvqIn,1,0,0,false);
      pTVar9 = GetThreadPoolAllocator();
      pbVar17 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                TPoolAllocator::allocate(pTVar9,0x28);
      pTVar9 = GetThreadPoolAllocator();
      *(TPoolAllocator **)pbVar17 = pTVar9;
      *(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> **)(pbVar17 + 8) =
           pbVar17 + 0x18;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar17,"InvocationId","");
      local_408[0]._0_8_ = local_408[0]._M_allocated_capacity & 0xffffffffffff007f | 0x1980;
      pTVar15 = makeInternalVariable(this,*(char **)(pbVar17 + 8),(TType *)local_420);
      iVar6 = (*(pTVar15->super_TSymbol)._vptr_TSymbol[0xd])(pTVar15);
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar6) + 0x50))
                        ((long *)CONCAT44(extraout_var_22,iVar6));
      uVar23 = (uint)*(ulong *)(lVar8 + 8) & 0x7f;
      if (uVar23 == 0x10) {
        uVar18 = 3;
LAB_0040996f:
        *(ulong *)(lVar8 + 8) = *(ulong *)(lVar8 + 8) & 0xffffffffffffff80 | uVar18;
      }
      else if (uVar23 == 0x11) {
        uVar18 = 4;
        goto LAB_0040996f;
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,pTVar15);
      pTVar13 = TIntermediate::addSymbol
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,pTVar15
                          );
    }
    pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar16 = TIntermediate::addSymbol(pTVar21,local_428);
    pTVar13 = (TIntermSymbol *)
              TIntermediate::addIndex
                        (pTVar21,EOpIndexIndirect,&pTVar16->super_TIntermTyped,
                         &pTVar13->super_TIntermTyped,loc);
    iVar6 = (*(local_428->super_TSymbol)._vptr_TSymbol[0xc])(local_428);
    TType::TType((TType *)local_420,(TType *)CONCAT44(extraout_var_23,iVar6),0,false);
    (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar13,(TType *)local_420);
  }
  else {
    pTVar13 = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,local_428
                        );
  }
  pTVar14 = handleAssign(this,loc,EOpAssign,&pTVar13->super_TIntermTyped,pTVar14);
LAB_00409a20:
  TIntermediate::growAggregate
            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
             (TIntermNode *)pTVar10,&pTVar14->super_TIntermNode);
  ppTVar20 = local_448.
             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
  if (0 < iVar6) {
    uVar18 = 0;
    do {
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,uVar18 & 0xffffffff)
      ;
      lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_24,iVar6) + 8) + 0x50))();
      if ((*(uint *)(lVar8 + 8) & 0x7f) - 0x11 < 2) {
        lVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_24,iVar6) + 8) + 0x50))();
        if ((*(uint *)(lVar8 + 8) & 0x1ff0000) == 0x930000) {
          this->gsStreamOutput = *ppTVar20;
        }
        else {
          pTVar21 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar13 = TIntermediate::addSymbol(pTVar21,*ppTVar20);
          pTVar16 = TIntermediate::addSymbol
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               *(TVariable **)(local_460 + uVar18 * 8));
          pTVar14 = handleAssign(this,loc,EOpAssign,&pTVar13->super_TIntermTyped,
                                 &pTVar16->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar21,(TIntermNode *)pTVar10,&pTVar14->super_TIntermNode);
        }
        ppTVar20 = ppTVar20 + 1;
      }
      uVar18 = uVar18 + 1;
      iVar6 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])();
    } while ((long)uVar18 < (long)iVar6);
  }
  (*(pTVar10->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
            (pTVar10,1);
  local_420._0_8_ = local_4b8;
  handleFunctionBody(this,loc,&local_388,(TIntermNode *)pTVar10,(TIntermNode **)local_420);
  uVar3 = local_420._0_8_;
  this->entryPointFunctionBody = (TIntermNode *)pTVar10;
  TFunction::~TFunction(&local_190);
  TFunction::~TFunction(&local_388);
  return (TIntermNode *)(TIntermAggregate *)uVar3;
}

Assistant:

TIntermNode* HlslParseContext::transformEntryPoint(const TSourceLoc& loc, TFunction& userFunction,
                                                   const TAttributes& attributes)
{
    // Return true if this is a tessellation patch constant function input to a domain shader.
    const auto isDsPcfInput = [this](const TType& type) {
        return language == EShLangTessEvaluation &&
        type.contains([](const TType* t) {
                return t->getQualifier().builtIn == EbvTessLevelOuter ||
                       t->getQualifier().builtIn == EbvTessLevelInner;
            });
    };

    // if we aren't in the entry point, fix the IO as such and exit
    if (! isEntrypointName(userFunction.getName())) {
        remapNonEntryPointIO(userFunction);
        return nullptr;
    }

    entryPointFunction = &userFunction; // needed in finish()

    // Handle entry point attributes
    handleEntryPointAttributes(loc, attributes);

    // entry point logic...

    // Move parameters and return value to shader in/out
    TVariable* entryPointOutput; // gets created in remapEntryPointIO
    TVector<TVariable*> inputs;
    TVector<TVariable*> outputs;
    remapEntryPointIO(userFunction, entryPointOutput, inputs, outputs);

    // Further this return/in/out transform by flattening, splitting, and assigning locations
    const auto makeVariableInOut = [&](TVariable& variable) {
        if (variable.getType().isStruct()) {
            bool arrayed = variable.getType().getQualifier().isArrayedIo(language);
            flatten(variable, false /* don't track linkage here, it will be tracked in assignToInterface() */, arrayed);
        }
        // TODO: flatten arrays too
        // TODO: flatten everything in I/O
        // TODO: replace all split with flatten, make all paths can create flattened I/O, then split code can be removed

        // For clip and cull distance, multiple output variables potentially get merged
        // into one in assignClipCullDistance.  That code in assignClipCullDistance
        // handles the interface logic, so we avoid it here in that case.
        if (!isClipOrCullDistance(variable.getType()))
            assignToInterface(variable);
    };
    if (entryPointOutput != nullptr)
        makeVariableInOut(*entryPointOutput);
    for (auto it = inputs.begin(); it != inputs.end(); ++it)
        if (!isDsPcfInput((*it)->getType()))  // wait until the end for PCF input (see comment below)
            makeVariableInOut(*(*it));
    for (auto it = outputs.begin(); it != outputs.end(); ++it)
        makeVariableInOut(*(*it));

    // In the domain shader, PCF input must be at the end of the linkage.  That's because in the
    // hull shader there is no ordering: the output comes from the separate PCF, which does not
    // participate in the argument list.  That is always put at the end of the HS linkage, so the
    // input side of the DS must match.  The argument may be in any position in the DS argument list
    // however, so this ensures the linkage is built in the correct order regardless of argument order.
    if (language == EShLangTessEvaluation) {
        for (auto it = inputs.begin(); it != inputs.end(); ++it)
            if (isDsPcfInput((*it)->getType()))
                makeVariableInOut(*(*it));
    }

    // Add uniform parameters to the $Global uniform block.
    TVector<TVariable*> opaque_uniforms;
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TType& paramType = *userFunction[i].type;
        TString& paramName = *userFunction[i].name;
        if (paramType.getQualifier().storage == EvqUniform) {
            if (!paramType.containsOpaque()) {
                // Add it to the global uniform block.
                growGlobalUniformBlock(loc, paramType, paramName);
            } else {
                // Declare it as a separate variable.
                TVariable *var = makeInternalVariable(paramName.c_str(), paramType);
                opaque_uniforms.push_back(var);
            }
        }
    }

    // Synthesize the call

    pushScope(); // matches the one in handleFunctionBody()

    // new signature
    TType voidType(EbtVoid);
    TFunction synthEntryPoint(&userFunction.getName(), voidType);
    TIntermAggregate* synthParams = new TIntermAggregate();
    intermediate.setAggregateOperator(synthParams, EOpParameters, voidType, loc);
    intermediate.setEntryPointMangledName(synthEntryPoint.getMangledName().c_str());
    intermediate.incrementEntryPointCount();
    TFunction callee(&userFunction.getName(), voidType); // call based on old name, which is still in the symbol table

    // change original name
    userFunction.addPrefix("@");                         // change the name in the function, but not in the symbol table

    // Copy inputs (shader-in -> calling arg), while building up the call node
    TVector<TVariable*> argVars;
    TIntermAggregate* synthBody = new TIntermAggregate();
    auto inputIt = inputs.begin();
    auto opaqueUniformIt = opaque_uniforms.begin();
    TIntermTyped* callingArgs = nullptr;

    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];
        argVars.push_back(makeInternalVariable(*param.name, *param.type));
        argVars.back()->getWritableType().getQualifier().makeTemporary();

        // Track the input patch, which is the only non-builtin supported by hull shader PCF.
        if (param.getDeclaredBuiltIn() == EbvInputPatch)
            inputPatch = argVars.back();

        TIntermSymbol* arg = intermediate.addSymbol(*argVars.back());
        handleFunctionArgument(&callee, callingArgs, arg);
        if (param.type->getQualifier().isParamInput()) {
            TIntermTyped* input = intermediate.addSymbol(**inputIt);
            if (input->getType().getQualifier().builtIn == EbvFragCoord && intermediate.getDxPositionW()) {
                // Replace FragCoord W with reciprocal
                auto pos_xyz = handleDotDereference(loc, input, "xyz");
                auto pos_w   = handleDotDereference(loc, input, "w");
                auto one     = intermediate.addConstantUnion(1.0, EbtFloat, loc);
                auto recip_w = intermediate.addBinaryMath(EOpDiv, one, pos_w, loc);
                TIntermAggregate* dst = new TIntermAggregate(EOpConstructVec4);
                dst->getSequence().push_back(pos_xyz);
                dst->getSequence().push_back(recip_w);
                dst->setType(TType(EbtFloat, EvqTemporary, 4));
                dst->setLoc(loc);
                input = dst;
            }
            intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg, input));
            inputIt++;
        }
        if (param.type->getQualifier().storage == EvqUniform) {
            if (!param.type->containsOpaque()) {
                // Look it up in the $Global uniform block.
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   handleVariable(loc, param.name)));
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   intermediate.addSymbol(**opaqueUniformIt)));
                ++opaqueUniformIt;
            }
        }
    }

    // Call
    currentCaller = synthEntryPoint.getMangledName();
    TIntermTyped* callReturn = handleFunctionCall(loc, &callee, callingArgs);
    currentCaller = userFunction.getMangledName();

    // Return value
    if (entryPointOutput) {
        TIntermTyped* returnAssign;

        // For hull shaders, the wrapped entry point return value is written to
        // an array element as indexed by invocation ID, which we might have to make up.
        // This is required to match SPIR-V semantics.
        if (language == EShLangTessControl) {
            TIntermSymbol* invocationIdSym = findTessLinkageSymbol(EbvInvocationId);

            // If there is no user declared invocation ID, we must make one.
            if (invocationIdSym == nullptr) {
                TType invocationIdType(EbtUint, EvqIn, 1);
                TString* invocationIdName = NewPoolTString("InvocationId");
                invocationIdType.getQualifier().builtIn = EbvInvocationId;

                TVariable* variable = makeInternalVariable(*invocationIdName, invocationIdType);

                globalQualifierFix(loc, variable->getWritableType().getQualifier());
                trackLinkage(*variable);

                invocationIdSym = intermediate.addSymbol(*variable);
            }

            TIntermTyped* element = intermediate.addIndex(EOpIndexIndirect, intermediate.addSymbol(*entryPointOutput),
                                                          invocationIdSym, loc);

            // Set the type of the array element being dereferenced
            const TType derefElementType(entryPointOutput->getType(), 0);
            element->setType(derefElementType);

            returnAssign = handleAssign(loc, EOpAssign, element, callReturn);
        } else {
            returnAssign = handleAssign(loc, EOpAssign, intermediate.addSymbol(*entryPointOutput), callReturn);
        }
        intermediate.growAggregate(synthBody, returnAssign);
    } else
        intermediate.growAggregate(synthBody, callReturn);

    // Output copies
    auto outputIt = outputs.begin();
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];

        // GS outputs are via emit, so we do not copy them here.
        if (param.type->getQualifier().isParamOutput()) {
            if (param.getDeclaredBuiltIn() == EbvGsOutputStream) {
                // GS output stream does not assign outputs here: it's the Append() method
                // which writes to the output, probably multiple times separated by Emit.
                // We merely remember the output to use, here.
                gsStreamOutput = *outputIt;
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign,
                                                                   intermediate.addSymbol(**outputIt),
                                                                   intermediate.addSymbol(*argVars[i])));
            }

            outputIt++;
        }
    }

    // Put the pieces together to form a full function subtree
    // for the synthesized entry point.
    synthBody->setOperator(EOpSequence);
    TIntermNode* synthFunctionDef = synthParams;
    handleFunctionBody(loc, synthEntryPoint, synthBody, synthFunctionDef);

    entryPointFunctionBody = synthBody;

    return synthFunctionDef;
}